

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemViewPrivate::droppingOnItself
          (QAbstractItemViewPrivate *this,QDropEvent *event,QModelIndex *index)

{
  bool bVar1;
  DropAction DVar2;
  DragDropMode DVar3;
  Int IVar4;
  QModelIndex *this_00;
  QModelIndex *pQVar5;
  QDropEvent *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  DropAction dropAction;
  QAbstractItemView *q;
  QModelIndex child;
  QModelIndexList selectedIndexes;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  bool bVar6;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff78;
  int iVar8;
  byte local_59;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QFlagsStorageHelper<Qt::DropAction,_4> local_10;
  QFlagsStorageHelper<Qt::DropAction,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QModelIndex *)q_func(in_RDI);
  DVar2 = QDropEvent::dropAction(in_RSI);
  DVar3 = QAbstractItemView::dragDropMode
                    ((QAbstractItemView *)CONCAT44(DVar2,in_stack_ffffffffffffff78));
  if (DVar3 == InternalMove) {
    DVar2 = MoveAction;
  }
  pQVar5 = (QModelIndex *)QDropEvent::source();
  uVar7 = false;
  if (pQVar5 == this_00) {
    local_10.super_QFlagsStorage<Qt::DropAction>.i =
         (QFlagsStorage<Qt::DropAction>)QDropEvent::possibleActions((QDropEvent *)in_RDI);
    local_c.super_QFlagsStorage<Qt::DropAction>.i =
         (QFlagsStorage<Qt::DropAction>)
         QFlags<Qt::DropAction>::operator&
                   ((QFlags<Qt::DropAction> *)in_RDI,
                    CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff6e,
                                            CONCAT11(in_stack_ffffffffffffff6d,
                                                     in_stack_ffffffffffffff6c))));
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    uVar7 = false;
    if (IVar4 != 0) {
      uVar7 = DVar2 == MoveAction;
    }
  }
  if ((bool)uVar7 != false) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x2d8))(&local_28);
    while( true ) {
      bVar1 = QModelIndex::isValid((QModelIndex *)in_RDI);
      bVar6 = false;
      if (bVar1) {
        bVar6 = ::operator!=((QModelIndex *)in_RDI,
                             (QPersistentModelIndex *)
                             CONCAT17(uVar7,(uint7)CONCAT15(in_stack_ffffffffffffff6d,
                                                            CONCAT14(in_stack_ffffffffffffff6c,
                                                                     in_stack_ffffffffffffff68))));
      }
      if (bVar6 == false) {
        iVar8 = 0;
        goto LAB_00806c43;
      }
      bVar1 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                        ((QListSpecialMethodsBase<QModelIndex> *)in_RDI,
                         (QModelIndex *)
                         CONCAT17(uVar7,CONCAT16(bVar6,CONCAT15(in_stack_ffffffffffffff6d,
                                                                CONCAT14(in_stack_ffffffffffffff6c,
                                                                         in_stack_ffffffffffffff68))
                                                )));
      if (bVar1) break;
      QModelIndex::parent(this_00);
    }
    local_59 = 1;
    iVar8 = 1;
LAB_00806c43:
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x806c4d);
    if (iVar8 != 0) goto LAB_00806c60;
  }
  local_59 = 0;
LAB_00806c60:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_59 & 1);
}

Assistant:

bool QAbstractItemViewPrivate::droppingOnItself(QDropEvent *event, const QModelIndex &index)
{
    Q_Q(QAbstractItemView);
    Qt::DropAction dropAction = event->dropAction();
    if (q->dragDropMode() == QAbstractItemView::InternalMove)
        dropAction = Qt::MoveAction;
    if (event->source() == q
        && event->possibleActions() & Qt::MoveAction
        && dropAction == Qt::MoveAction) {
        QModelIndexList selectedIndexes = q->selectedIndexes();
        QModelIndex child = index;
        while (child.isValid() && child != root) {
            if (selectedIndexes.contains(child))
                return true;
            child = child.parent();
        }
    }
    return false;
}